

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

VW_HANDLE VW_InitializeWithModel(char *pstrArgs,char *modelData,size_t modelDataSize)

{
  pointer pmVar1;
  vw *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  vw *all;
  unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_> buf;
  pointer in_stack_ffffffffffffff68;
  unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_> *in_stack_ffffffffffffff70;
  memory_io_buf *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [24];
  void *in_stack_ffffffffffffffc0;
  trace_message_t in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd7;
  io_buf *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  
  operator_new(200);
  memory_io_buf::memory_io_buf(in_stack_ffffffffffffff90);
  std::unique_ptr<memory_io_buf,std::default_delete<memory_io_buf>>::
  unique_ptr<std::default_delete<memory_io_buf>,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pmVar1 = std::unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_>::operator->
                     ((unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_> *)0x1a6159);
  (*(pmVar1->super_io_buf)._vptr_io_buf[6])(pmVar1,0xffffffff,in_RSI,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,in_RDI,&local_59);
  std::unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_>::get
            (in_stack_ffffffffffffff70);
  this = VW::initialize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        (bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_>::~unique_ptr
            ((unique_ptr<memory_io_buf,_std::default_delete<memory_io_buf>_> *)this);
  return this;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_InitializeWithModel(const char * pstrArgs, const char * modelData, size_t modelDataSize)
{
    unique_ptr<memory_io_buf> buf(new memory_io_buf);
    buf->write_file(-1, modelData, modelDataSize);

    vw* all = VW::initialize(string(pstrArgs), buf.get());
    return static_cast<VW_HANDLE>(all);
}